

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall
HEkk::debugSimplexDualInfeasible(HEkk *this,string *message,bool force_report)

{
  computeSimplexDualInfeasible(this);
  if ((this->info_).num_dual_infeasibilities != 0 || force_report) {
    printf("Iteration %6d: %s num / max / sum dual infeasibilities is %d / %g / %g\n",
           (this->info_).max_dual_infeasibility,(this->info_).sum_dual_infeasibilities,
           (ulong)(uint)this->iteration_count_,(message->_M_dataplus)._M_p);
  }
  return kOk;
}

Assistant:

HighsDebugStatus HEkk::debugSimplexDualInfeasible(const std::string message,
                                                  const bool force_report) {
  const HighsSimplexInfo& info = this->info_;
  computeSimplexDualInfeasible();
  if (info.num_dual_infeasibilities || force_report)
    printf(
        "Iteration %6d: %s num / max / sum dual infeasibilities is %d / %g / "
        "%g\n",
        (int)iteration_count_, message.c_str(),
        (int)info.num_dual_infeasibilities, info.max_dual_infeasibility,
        info.sum_dual_infeasibilities);
  return HighsDebugStatus::kOk;
}